

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

bool __thiscall
Lib::FlatteningIterator<Kernel::LookaheadLiteralSelector::GenIteratorIterator>::hasNext
          (FlatteningIterator<Kernel::LookaheadLiteralSelector::GenIteratorIterator> *this)

{
  bool bVar1;
  GenIteratorIterator *in_RDI;
  GenIteratorIterator *in_stack_000001c8;
  Option<Lib::VirtualIterator<std::tuple<>_>_> *in_stack_ffffffffffffff98;
  Option<Lib::VirtualIterator<std::tuple<>_>_> *in_stack_ffffffffffffffa0;
  Option<Lib::VirtualIterator<std::tuple<>_>_> local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  while( true ) {
    bVar1 = OptionBase<Lib::VirtualIterator<std::tuple<>_>_>::isSome
                      ((OptionBase<Lib::VirtualIterator<std::tuple<>_>_> *)(in_RDI + 1));
    if (!bVar1) {
      return false;
    }
    Option<Lib::VirtualIterator<std::tuple<>_>_>::operator->
              ((Option<Lib::VirtualIterator<std::tuple<>_>_> *)0x8a0488);
    bVar1 = VirtualIterator<std::tuple<>_>::hasNext((VirtualIterator<std::tuple<>_> *)0x8a0490);
    if (bVar1) break;
    bVar1 = Kernel::LookaheadLiteralSelector::GenIteratorIterator::hasNext(in_stack_000001c8);
    if (bVar1) {
      in_stack_ffffffffffffffa0 = &local_38;
      Kernel::LookaheadLiteralSelector::GenIteratorIterator::next(in_RDI);
      move_if_value<Lib::VirtualIterator<std::tuple<>_>,_true>
                ((VirtualIterator<std::tuple<>_> *)in_stack_ffffffffffffff98);
      Option<Lib::VirtualIterator<std::tuple<>_>_>::OptionBase
                (in_stack_ffffffffffffffa0,
                 (VirtualIterator<std::tuple<>_> *)in_stack_ffffffffffffff98);
    }
    else {
      local_28 = 0;
      uStack_20 = 0;
      Option<Lib::VirtualIterator<std::tuple<>_>_>::Option
                ((Option<Lib::VirtualIterator<std::tuple<>_>_> *)0x8a050e);
    }
    Option<Lib::VirtualIterator<std::tuple<>_>_>::operator=
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Option<Lib::VirtualIterator<std::tuple<>_>_>::~Option
              ((Option<Lib::VirtualIterator<std::tuple<>_>_> *)0x8a0531);
    if (bVar1) {
      VirtualIterator<std::tuple<>_>::~VirtualIterator
                ((VirtualIterator<std::tuple<>_> *)in_stack_ffffffffffffffa0);
      VirtualIterator<std::tuple<>_>::~VirtualIterator
                ((VirtualIterator<std::tuple<>_> *)in_stack_ffffffffffffffa0);
    }
  }
  return true;
}

Assistant:

bool hasNext()
  {
    while (_current.isSome()) {
      if (_current->hasNext()) {
        return true;
      } else {
        _current = _master.hasNext() 
          ? Option<Inner>(move_if_value<Inner>(_master.next())) 
          : Option<Inner>();
      }
    }
    return false;
  }